

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

JavascriptString * __thiscall
Js::ParseableFunctionInfo::GetExternalDisplayNameObject
          (ParseableFunctionInfo *this,ScriptContext *scriptContext)

{
  char16 *content;
  JavascriptString *pJVar1;
  
  content = GetExternalDisplayName<Js::ParseableFunctionInfo>(this);
  if (((((((this->super_FunctionProxy).field_0x44 & 0x20) == 0) && (content != L"Function code")) &&
       (content != L"Unknown script code")) &&
      ((content != L"anonymous" && (content != L"Module code")))) &&
     ((content != L"Global code" && ((content != L"glo" && (content != L"Anonymous function")))))) {
    pJVar1 = JavascriptString::NewCopySz(content,scriptContext);
    return pJVar1;
  }
  pJVar1 = JavascriptString::NewWithSz(content,scriptContext);
  return pJVar1;
}

Assistant:

JavascriptString* ParseableFunctionInfo::GetExternalDisplayNameObject(ScriptContext* scriptContext) const
    {
        const char16* name = GetExternalDisplayName();

        if (!GetDisplayNameIsRecyclerAllocated() && !IsConstantFunctionName(name))
        {
            // The string is allocated in memory that we don't directly control the lifetime of. Copy the string to
            // ensure that the buffer remains valid for the lifetime of the object.
            return Js::JavascriptString::NewCopySz(name, scriptContext);
        }
        else
        {
            // Use the incoming buffer directly to create the object. This only works when the lifetime of the data is
            // static or GC allocated.
            return Js::JavascriptString::NewWithSz(name, scriptContext);
        }
    }